

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cards.cpp
# Opt level: O1

void __thiscall Deck::createDeck(Deck *this)

{
  pointer __first;
  uint uVar1;
  ulong uVar2;
  vector<CardType,_std::allocator<CardType>_> *this_00;
  size_t __i;
  long lVar3;
  vector<CardType,_std::allocator<CardType>_> deck;
  vector<CardType,_std::allocator<CardType>_> local_2740;
  random_device local_2728;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13a0;
  
  populateDeck(&local_2740,this);
  __first = local_2740.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::random_device::random_device(&local_2728);
  uVar1 = std::random_device::_M_getval();
  local_13a0._M_x[0] = (unsigned_long)uVar1;
  lVar3 = 1;
  uVar2 = local_13a0._M_x[0];
  do {
    uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar3);
    local_13a0._M_x[lVar3] = uVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  local_13a0._M_p = 0x270;
  std::
  shuffle<__gnu_cxx::__normal_iterator<CardType*,std::vector<CardType,std::allocator<CardType>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            ((__normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_>)
             __first,(__normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_>
                      )local_2740.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_13a0);
  std::random_device::_M_fini();
  this_00 = (vector<CardType,_std::allocator<CardType>_> *)operator_new(0x18);
  std::vector<CardType,_std::allocator<CardType>_>::vector(this_00,&local_2740);
  this->deckPointer = this_00;
  if (local_2740.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
      super__Vector_impl_data._M_start != (CardType *)0x0) {
    operator_delete(local_2740.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2740.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_2740.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Deck::createDeck() {
    std::vector<CardType> deck = Deck::populateDeck();
    std::shuffle(deck.begin(), deck.end(), std::mt19937(std::random_device()()));
    deckPointer = new std::vector<CardType>(deck); //store value on the heap to avoid losing it
}